

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O3

void rw::ps2::printDMAVIF(InstanceData *inst)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  long lVar4;
  uint *puVar5;
  
  puVar2 = (uint *)inst->data;
  puVar5 = puVar2;
LAB_0012894f:
  do {
    uVar1 = *puVar5;
    uVar3 = uVar1 & 0x70000000;
    while( true ) {
      if (uVar3 == 0x60000000) {
        printf("DMAret %04x %08x\n",(ulong)(uVar1 & 0xffff),(ulong)puVar5[1]);
        sendVIF(puVar5[2]);
        sendVIF(puVar5[3]);
        if ((uVar1 & 0xffff) != 0) {
          lVar4 = 0;
          do {
            sendVIF(*(uint32 *)((long)puVar5 + lVar4 + 0x10));
            lVar4 = lVar4 + 4;
          } while ((uVar1 & 0xffff) << 4 != (int)lVar4);
        }
        putchar(10);
        return;
      }
      if (uVar3 == 0x30000000) break;
      if (uVar3 == 0x10000000) goto code_r0x00128973;
    }
    printf("DMAref %04x %08x\n",(ulong)(uVar1 & 0xffff),(ulong)puVar5[1]);
    sendVIF(puVar5[2]);
    sendVIF(puVar5[3]);
    if ((uVar1 & 0xffff) != 0) {
      uVar3 = puVar5[1];
      lVar4 = 0;
      do {
        sendVIF(puVar2[(ulong)(uVar3 << 2) + lVar4]);
        lVar4 = lVar4 + 1;
      } while ((uVar1 & 0xffff) << 2 != (int)lVar4);
    }
    puVar5 = puVar5 + 4;
  } while( true );
code_r0x00128973:
  uVar3 = uVar1 & 0xffff;
  printf("DMAcnt %04x %08x\n",(ulong)uVar3,(ulong)puVar5[1]);
  sendVIF(puVar5[2]);
  sendVIF(puVar5[3]);
  if ((ulong)uVar3 == 0) {
    lVar4 = 4;
  }
  else {
    lVar4 = 0;
    do {
      sendVIF(*(uint32 *)((long)puVar5 + lVar4 + 0x10));
      lVar4 = lVar4 + 4;
    } while ((uVar1 & 0xffff) << 4 != (int)lVar4);
    lVar4 = (ulong)(uVar3 << 2) + 4;
  }
  puVar5 = puVar5 + lVar4;
  goto LAB_0012894f;
}

Assistant:

void
printDMAVIF(InstanceData *inst)
{
	uint32 *tag = (uint32*)inst->data;
	uint32 *base = (uint32*)inst->data;
	uint32 qwc;

	for(;;){
		qwc = tag[0]&0xFFFF;
		switch(tag[0]&0x70000000){
		case DMAcnt:
			printf("DMAcnt %04x %08x\n", qwc, tag[1]);
			sendVIF(tag[2]);
			sendVIF(tag[3]);
			dmaVIF(qwc, tag+4);
			tag += (1+qwc)*4;
			break;

		case DMAref:
			printf("DMAref %04x %08x\n", qwc, tag[1]);
			sendVIF(tag[2]);
			sendVIF(tag[3]);
			dmaVIF(qwc, base + tag[1]*4);
			tag += 4;
			break;

		case DMAret:
			printf("DMAret %04x %08x\n", qwc, tag[1]);
			sendVIF(tag[2]);
			sendVIF(tag[3]);
			dmaVIF(qwc, tag+4);
			printf("\n");
			return;
		}
	}
}